

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_native_rcb_part(REF_GRID ref_grid,REF_INT npart,REF_INT *node_part)

{
  REF_NODE pRVar1;
  REF_MPI ref_mpi_00;
  int iVar2;
  int iVar3;
  uint uVar4;
  REF_DBL *xyz_00;
  REF_INT *owners_00;
  double local_110;
  double local_108;
  double local_100;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL z;
  REF_DBL psi;
  REF_DBL theta;
  REF_DBL phi;
  REF_DBL transform [9];
  REF_INT *locals;
  REF_INT *owners;
  REF_INT offset;
  REF_DBL *xyz;
  int local_58;
  REF_INT n;
  REF_INT i;
  REF_INT node;
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_INT *node_part_local;
  REF_INT npart_local;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  ref_mpi_00 = ref_grid->mpi;
  for (n = 0; n < pRVar1->max; n = n + 1) {
    node_part[n] = -1;
  }
  iVar3 = pRVar1->n;
  if (iVar3 * 3 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x237
           ,"ref_migrate_native_rcb_part","malloc xyz of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    xyz_00 = (REF_DBL *)malloc((long)(iVar3 * 3) << 3);
    if (xyz_00 == (REF_DBL *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x237,"ref_migrate_native_rcb_part","malloc xyz of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else if (iVar3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x238,"ref_migrate_native_rcb_part","malloc owners of REF_INT negative");
      ref_grid_local._4_4_ = 1;
    }
    else {
      owners_00 = (REF_INT *)malloc((long)iVar3 << 2);
      if (owners_00 == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x238,"ref_migrate_native_rcb_part","malloc owners of REF_INT NULL");
        ref_grid_local._4_4_ = 2;
      }
      else if (iVar3 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x239,"ref_migrate_native_rcb_part","malloc locals of REF_INT negative");
        ref_grid_local._4_4_ = 1;
      }
      else {
        transform[8] = (REF_DBL)malloc((long)iVar3 << 2);
        if ((void *)transform[8] == (void *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x239,"ref_migrate_native_rcb_part","malloc locals of REF_INT NULL");
          ref_grid_local._4_4_ = 2;
        }
        else {
          xyz._4_4_ = 0;
          for (n = 0; n < pRVar1->max; n = n + 1) {
            if ((((-1 < n) && (n < pRVar1->max)) && (-1 < pRVar1->global[n])) &&
               (pRVar1->ref_mpi->id == pRVar1->part[n])) {
              for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
                xyz_00[local_58 + xyz._4_4_ * 3] = pRVar1->real[local_58 + n * 0xf];
              }
              owners_00[xyz._4_4_] = pRVar1->part[n];
              *(REF_INT *)((long)transform[8] + (long)xyz._4_4_ * 4) = n;
              xyz._4_4_ = xyz._4_4_ + 1;
            }
          }
          if (ref_mpi_00->id == 0) {
            if (ref_grid->twod == 0) {
              iVar2 = rand();
              iVar3 = rand();
              local_108 = ((double)iVar3 * 2.0) / 2147483647.0 - 1.0;
              local_100 = local_108;
              if (1.0 <= local_108) {
                local_100 = 1.0;
              }
              if (local_100 <= -1.0) {
                local_110 = -1.0;
              }
              else {
                if (1.0 <= local_108) {
                  local_108 = 1.0;
                }
                local_110 = local_108;
              }
              psi = acos(local_110);
              iVar3 = rand();
              z = ((double)iVar3 * 6.28318530717958) / 2147483647.0;
            }
            else {
              iVar2 = rand();
              psi = 0.0;
              z = 0.0;
            }
            theta = ((double)iVar2 * 6.28318530717958) / 2147483647.0;
            uVar4 = ref_matrix_euler_rotation(theta,psi,z,&phi);
            if (uVar4 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x252,"ref_migrate_native_rcb_part",(ulong)uVar4,"rot");
              return uVar4;
            }
          }
          ref_grid_local._4_4_ = ref_mpi_bcast(ref_mpi_00,&phi,9,3);
          if (ref_grid_local._4_4_ == 0) {
            ref_grid_local._4_4_ =
                 ref_migrate_native_rcb_direction
                           (ref_mpi_00,xyz._4_4_,xyz_00,&phi,npart,0,owners_00,
                            (REF_INT *)transform[8],ref_mpi_00,node_part,ref_grid->partitioner_seed,
                            -1,ref_grid->twod);
            if (ref_grid_local._4_4_ == 0) {
              ref_grid->partitioner_seed = ref_grid->partitioner_seed + 1;
              if (ref_grid->partitioner_seed < 0) {
                ref_grid->partitioner_seed = 0;
              }
              if (transform[8] != 0.0) {
                free((void *)transform[8]);
              }
              if (owners_00 != (REF_INT *)0x0) {
                free(owners_00);
              }
              if (xyz_00 != (REF_DBL *)0x0) {
                free(xyz_00);
              }
              ref_mpi_stopwatch_stop(ref_grid->mpi,"native RCB part");
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x25a,"ref_migrate_native_rcb_part",(ulong)ref_grid_local._4_4_,"split");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x254,"ref_migrate_native_rcb_part",(ulong)ref_grid_local._4_4_,"bcast xform");
          }
        }
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_native_rcb_part(REF_GRID ref_grid,
                                                      REF_INT npart,
                                                      REF_INT *node_part) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_INT node;
  REF_INT i, n;
  REF_DBL *xyz;
  REF_INT offset;
  REF_INT *owners;
  REF_INT *locals;
  REF_DBL transform[9];

  for (node = 0; node < ref_node_max(ref_node); node++)
    node_part[node] = REF_EMPTY;

  offset = 0;

  n = ref_node_n(ref_node);
  ref_malloc(xyz, 3 * n, REF_DBL);
  ref_malloc(owners, n, REF_INT);
  ref_malloc(locals, n, REF_INT);
  n = 0;
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      for (i = 0; i < 3; i++) xyz[i + 3 * n] = ref_node_xyz(ref_node, i, node);
      owners[n] = ref_node_part(ref_node, node);
      locals[n] = node;
      n++;
    }
  }

  if (ref_mpi_once(ref_mpi)) {
    REF_DBL phi, theta, psi, z;
    if (ref_grid_twod(ref_grid)) { /* restrict rotation to x-y plane */
      phi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
      theta = 0.0;
      psi = 0.0;
    } else { /* not exactly unirom sampling, should be good enough */
      phi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
      z = 2.0 * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX - 1.0;
      z = MAX(MIN(z, 1.0), -1.0); /* redundant nan safety */
      theta = acos(z);
      psi = 2.0 * ref_math_pi * (REF_DBL)(rand()) / (REF_DBL)RAND_MAX;
    }
    /* printf("phi %f theta %f psi %f\n",phi,theta,psi); */
    RSS(ref_matrix_euler_rotation(phi, theta, psi, transform), "rot");
  }
  RSS(ref_mpi_bcast(ref_mpi, transform, 9, REF_DBL_TYPE), "bcast xform");

  RSS(ref_migrate_native_rcb_direction(
          ref_mpi, n, xyz, transform, npart, offset, owners, locals, ref_mpi,
          node_part, ref_grid_partitioner_seed(ref_grid), -1,
          ref_grid_twod(ref_grid)),
      "split");
  ref_grid_partitioner_seed(ref_grid)++;
  if (ref_grid_partitioner_seed(ref_grid) < 0)
    ref_grid_partitioner_seed(ref_grid) = 0; /* overflow int */

  ref_free(locals);
  ref_free(owners);
  ref_free(xyz);

  ref_mpi_stopwatch_stop(ref_grid_mpi(ref_grid), "native RCB part");

  return REF_SUCCESS;
}